

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Dyn *x)

{
  bool bVar1;
  byte bVar2;
  pointer pbVar3;
  long *plVar4;
  ELF_Dyn *x_local;
  cmELFInternalImpl<cmELFTypes64> *this_local;
  
  pbVar3 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->(&(this->super_cmELFInternal).Stream);
  plVar4 = (long *)std::istream::read((char *)pbVar3,(long)x);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if ((bVar1) && (((this->super_cmELFInternal).NeedSwap & 1U) != 0)) {
    ByteSwap(this,x);
  }
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::operator->(&(this->super_cmELFInternal).Stream);
  bVar2 = std::ios::fail();
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool Read(ELF_Dyn& x)
  {
    if (this->Stream->read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      this->ByteSwap(x);
    }
    return !this->Stream->fail();
  }